

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O1

void __thiscall ON_ClassArray<ON_String>::Empty(ON_ClassArray<ON_String> *this)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  
  lVar3 = (long)*(int *)(this + 0x10);
  if (0 < lVar3) {
    lVar4 = lVar3 * 8;
    lVar2 = 1;
    do {
      lVar4 = lVar4 + -8;
      ON_String::~ON_String((ON_String *)(*(long *)(this + 8) + lVar4));
      *(undefined8 *)(*(long *)(this + 8) + lVar4) = 0;
      ON_String::ON_String((ON_String *)(*(long *)(this + 8) + lVar4));
      lVar1 = lVar3 + lVar2;
      lVar2 = lVar2 + -1;
    } while (1 < lVar1 + -1);
  }
  *(undefined4 *)(this + 0x10) = 0;
  return;
}

Assistant:

void ON_ClassArray<T>::Empty()
{
  int i;
  for ( i = m_count-1; i >= 0; i-- ) {
    DestroyElement( m_a[i] );
    // This call to memset is ok even when T has a vtable
    // because in-place construction is used later.
    memset( (void*)(&m_a[i]), 0, sizeof(T) );
    ConstructDefaultElement( &m_a[i] );
  }
  m_count = 0;
}